

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::parseInput(Parser *this,InputDeclaration *inputDeclaration)

{
  bool bVar1;
  uint32_t uVar2;
  EndpointType EVar3;
  Identifier IVar4;
  vector<soul::Type,_std::allocator<soul::Type>_> local_58;
  vector<soul::Type,_std::allocator<soul::Type>_> local_38;
  
  IVar4 = parseGeneralIdentifier(this);
  (inputDeclaration->super_IODeclaration).name.name = IVar4.name;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2a495b);
  if (bVar1) {
    uVar2 = parseProcessorArraySize(this);
    (inputDeclaration->super_IODeclaration).arraySize.super__Optional_base<unsigned_int,_true,_true>
    ._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)uVar2 | 0x100000000);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x27affb);
  }
  EVar3 = parseEndpointType<soul::heart::Parser>(this);
  (inputDeclaration->super_IODeclaration).endpointType = EVar3;
  readEventTypeList(&local_58,this);
  local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (inputDeclaration->super_IODeclaration).dataTypes.
       super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (inputDeclaration->super_IODeclaration).dataTypes.
  super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_start =
       (inputDeclaration->super_IODeclaration).dataTypes.
       super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_38.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (inputDeclaration->super_IODeclaration).dataTypes.
       super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (inputDeclaration->super_IODeclaration).dataTypes.
  super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
  (inputDeclaration->super_IODeclaration).dataTypes.
  super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_38);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_58);
  IODeclaration::checkDataTypesValid<soul::CodeLocation&>
            (&inputDeclaration->super_IODeclaration,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  parseAnnotation(this,&(inputDeclaration->super_IODeclaration).annotation);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27ca5c);
  return;
}

Assistant:

void parseInput (heart::InputDeclaration& inputDeclaration)
    {
        inputDeclaration.name = parseGeneralIdentifier();

        if (matchIf (HEARTOperator::openBracket))
        {
            inputDeclaration.arraySize = parseProcessorArraySize();
            expect (HEARTOperator::closeBracket);
        }

        inputDeclaration.endpointType = parseEndpointType (*this);
        inputDeclaration.dataTypes = readEventTypeList();

        inputDeclaration.checkDataTypesValid (location);
        parseAnnotation (inputDeclaration.annotation);
        expectSemicolon();
    }